

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  long in_RSI;
  long in_RDI;
  Mat borderm;
  Mat m;
  int q;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Mat *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Mat *in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Mat *in_stack_ffffffffffffff68;
  Mat *in_stack_ffffffffffffff70;
  undefined4 local_4c;
  undefined4 local_4;
  
  if ((((*(int *)(in_RDI + 0x80) == 0) && (*(int *)(in_RDI + 0x84) == 0)) &&
      (*(int *)(in_RDI + 0x88) == 0)) && (*(int *)(in_RDI + 0x8c) == 0)) {
    Mat::operator=(in_stack_ffffffffffffff38,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    local_4 = 0;
  }
  else {
    iVar1 = *(int *)(in_RSI + 0x2c);
    iVar2 = *(int *)(in_RSI + 0x20);
    lVar3 = *(long *)(in_RSI + 0x10);
    if (iVar2 == 1) {
      Mat::create(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (Allocator *)in_stack_ffffffffffffff38);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (lVar3 == 1) {
          copy_make_border_image<signed_char>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     (char)((uint)in_stack_ffffffffffffff58 >> 0x18));
        }
        else if (lVar3 == 4) {
          copy_make_border_image<float>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 2) {
      Mat::create(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (Allocator *)in_stack_ffffffffffffff38);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (lVar3 == 1) {
          copy_make_border_image<signed_char>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     (char)((uint)in_stack_ffffffffffffff58 >> 0x18));
        }
        else if (lVar3 == 4) {
          copy_make_border_image<float>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 3) {
      Mat::create(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                  in_stack_ffffffffffffff44,(size_t)in_stack_ffffffffffffff38,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
          Mat::channel(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
          Mat::channel(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
          if (lVar3 == 1) {
            copy_make_border_image<signed_char>
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
                       ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                       (char)((uint)in_stack_ffffffffffffff58 >> 0x18));
          }
          else if (lVar3 == 4) {
            copy_make_border_image<float>
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
                       ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                       in_stack_ffffffffffffff58);
          }
          Mat::~Mat((Mat *)0x147d76);
          Mat::~Mat((Mat *)0x147d80);
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, value);
            else if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, value);
        }

        return 0;
    }

    return 0;
}